

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.h
# Opt level: O3

intmax_t __thiscall pstack::Dwarf::DWARFReader::getint(DWARFReader *this,size_t len)

{
  ulong uVar1;
  Exception *this_00;
  Exception local_1d8;
  byte local_38 [8];
  uint8_t bytes [16];
  
  if (0xffffffffffffffef < len - 0x11) {
    Reader::readObj<unsigned_char>
              ((this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,this->off,local_38,len);
    this->off = this->off + len;
    uVar1 = (ulong)((char)local_38[len - 1] >> 7);
    do {
      uVar1 = (ulong)local_38[len - 1] | uVar1 << 8;
      len = len - 1;
    } while (len != 0);
    return uVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset(&local_1d8,0,0x1a0);
  Exception::Exception(&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1d8.str,"can\'t deal with ints of size ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1d8.str);
  Exception::Exception(this_00,&local_1d8);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

intmax_t getint(size_t len) {
        intmax_t rc;
        uint8_t bytes[16];
        if (len > 16 || len < 1)
            throw Exception() << "can't deal with ints of size " << len;
        io->readObj(off, bytes, len);
        off += len;
        uint8_t *p = bytes + len;
        rc = (p[-1] & 0x80) ? -1 : 0;
        for (size_t i = 1; i <= len; i++)
            rc = rc << 8 | p[-i];
        return rc;
    }